

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O0

int loadline(lua_State *L)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int status;
  lua_State *L_local;
  
  lua_settop(L,0);
  iVar1 = pushline(L,1);
  if (iVar1 == 0) {
    L_local._4_4_ = -1;
  }
  else {
    while( true ) {
      uVar2 = lua_tolstring(L,1,0);
      uVar3 = lua_objlen(L,1);
      L_local._4_4_ = luaL_loadbuffer(L,uVar2,uVar3,"=stdin");
      iVar1 = incomplete(L,L_local._4_4_);
      if (iVar1 == 0) break;
      iVar1 = pushline(L,0);
      if (iVar1 == 0) {
        return -1;
      }
      lua_pushlstring(L,"\n",1);
      lua_insert(L,0xfffffffe);
      lua_concat(L,3);
    }
    lua_remove(L,1);
  }
  return L_local._4_4_;
}

Assistant:

static int loadline(lua_State *L)
{
  int status;
  lua_settop(L, 0);
  if (!pushline(L, 1))
    return -1;  /* no input */
  for (;;) {  /* repeat until gets a complete line */
    status = luaL_loadbuffer(L, lua_tostring(L, 1), lua_strlen(L, 1), "=stdin");
    if (!incomplete(L, status)) break;  /* cannot try to add lines? */
    if (!pushline(L, 0))  /* no more input? */
      return -1;
    lua_pushliteral(L, "\n");  /* add a new line... */
    lua_insert(L, -2);  /* ...between the two lines */
    lua_concat(L, 3);  /* join them */
  }
  lua_remove(L, 1);  /* remove line */
  return status;
}